

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O3

void skewness_api_suite::test_size(void)

{
  undefined8 local_40;
  undefined4 local_34;
  
  local_40 = 0;
  local_34 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0x1d5,"void skewness_api_suite::test_size()",&local_40,&local_34);
  local_40 = 1;
  local_34 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0x1d7,"void skewness_api_suite::test_size()",&local_40,&local_34);
  local_40 = 2;
  local_34 = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0x1d9,"void skewness_api_suite::test_size()",&local_40,&local_34);
  local_40 = 3;
  local_34 = 3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","3",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0x1db,"void skewness_api_suite::test_size()",&local_40,&local_34);
  local_40 = 4;
  local_34 = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0x1dd,"void skewness_api_suite::test_size()",&local_40,&local_34);
  local_40 = 4;
  local_34 = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0x1df,"void skewness_api_suite::test_size()",&local_40,&local_34);
  return;
}

Assistant:

void test_size()
{
    interim::moment_skewness<double, 4> filter;
    TRIAL_TEST_EQ(filter.size(), 0);
    filter.push(1.0);
    TRIAL_TEST_EQ(filter.size(), 1);
    filter.push(2.0);
    TRIAL_TEST_EQ(filter.size(), 2);
    filter.push(3.0);
    TRIAL_TEST_EQ(filter.size(), 3);
    filter.push(4.0);
    TRIAL_TEST_EQ(filter.size(), 4);
    filter.push(5.0);
    TRIAL_TEST_EQ(filter.size(), 4);
}